

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int decode_session_identifier
              (uint64_t *issued_at,ptls_iovec_t *psk,uint32_t *ticket_age_add,
              ptls_iovec_t *server_name,uint16_t *key_exchange_id,uint16_t *csid,
              ptls_iovec_t *negotiated_protocol,uint8_t *src,uint8_t *end)

{
  long *plVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  byte *pbVar6;
  byte *end_00;
  ushort *local_38;
  
  if (1 < (ulong)((long)end - (long)src)) {
    uVar4 = (ulong)(ushort)(*(ushort *)src << 8 | *(ushort *)src >> 8);
    plVar1 = (long *)(src + 2);
    if (((uVar4 <= (ulong)((long)end - (long)plVar1)) && (7 < uVar4)) &&
       (*plVar1 == 0x31303030736c7470)) {
      end_00 = (byte *)((long)plVar1 + uVar4);
      local_38 = (ushort *)(src + 10);
      iVar3 = ptls_decode64(issued_at,(uint8_t **)&local_38,end_00);
      if (iVar3 != 0) {
        return iVar3;
      }
      if (1 < (ulong)((long)end_00 - (long)local_38)) {
        uVar4 = (ulong)(ushort)(*local_38 << 8 | *local_38 >> 8);
        local_38 = local_38 + 1;
        if (uVar4 <= (ulong)((long)end_00 - (long)local_38)) {
          psk->base = (uint8_t *)local_38;
          local_38 = (ushort *)((long)local_38 + uVar4);
          psk->len = uVar4;
          lVar5 = (long)end_00 - (long)local_38;
          if (((1 < lVar5) && (*key_exchange_id = *local_38 << 8 | *local_38 >> 8, 1 < lVar5 + -2))
             && (*csid = local_38[1] << 8 | local_38[1] >> 8, 3 < lVar5 + -4)) {
            uVar2 = *(uint *)(local_38 + 2);
            *ticket_age_add =
                 uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
            if (1 < lVar5 - 8U) {
              uVar4 = (ulong)(ushort)(local_38[4] << 8 | local_38[4] >> 8);
              local_38 = local_38 + 5;
              if (uVar4 <= (ulong)((long)end_00 - (long)local_38)) {
                server_name->base = (uint8_t *)local_38;
                pbVar6 = (byte *)((long)local_38 + uVar4);
                server_name->len = uVar4;
                if (end_00 != pbVar6) {
                  uVar4 = (ulong)*pbVar6;
                  pbVar6 = pbVar6 + 1;
                  if (uVar4 <= (ulong)((long)end_00 - (long)pbVar6)) {
                    negotiated_protocol->base = pbVar6;
                    negotiated_protocol->len = uVar4;
                    if (pbVar6 + uVar4 != end_00) {
                      return 0x32;
                    }
                    if (end_00 != end) {
                      return 0x32;
                    }
                    return 0;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return 0x32;
}

Assistant:

int decode_session_identifier(uint64_t *issued_at, ptls_iovec_t *psk, uint32_t *ticket_age_add, ptls_iovec_t *server_name,
                              uint16_t *key_exchange_id, uint16_t *csid, ptls_iovec_t *negotiated_protocol, const uint8_t *src,
                              const uint8_t *const end)
{
    int ret = 0;

    ptls_decode_block(src, end, 2, {
        if (end - src < SESSION_IDENTIFIER_MAGIC_SIZE ||
            memcmp(src, SESSION_IDENTIFIER_MAGIC, SESSION_IDENTIFIER_MAGIC_SIZE) != 0) {
            ret = PTLS_ALERT_DECODE_ERROR;
            goto Exit;
        }
        src += SESSION_IDENTIFIER_MAGIC_SIZE;
        if ((ret = ptls_decode64(issued_at, &src, end)) != 0)
            goto Exit;
        ptls_decode_open_block(src, end, 2, {
            *psk = ptls_iovec_init(src, end - src);
            src = end;
        });
        if ((ret = ptls_decode16(key_exchange_id, &src, end)) != 0)
            goto Exit;
        if ((ret = ptls_decode16(csid, &src, end)) != 0)
            goto Exit;
        if ((ret = ptls_decode32(ticket_age_add, &src, end)) != 0)
            goto Exit;
        ptls_decode_open_block(src, end, 2, {
            *server_name = ptls_iovec_init(src, end - src);
            src = end;
        });
        ptls_decode_open_block(src, end, 1, {
            *negotiated_protocol = ptls_iovec_init(src, end - src);
            src = end;
        });
    });

Exit:
    return ret;
}